

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

SnapshotCompletionResult __thiscall
ChainstateManager::MaybeCompleteSnapshotValidation(ChainstateManager *this)

{
  int height;
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  pointer ppCVar3;
  CBlockIndex *this_00;
  bool bVar4;
  SnapshotCompletionResult SVar5;
  Chainstate *pCVar6;
  optional<int> *poVar7;
  CBlockIndex **ppCVar8;
  optional<uint256> *poVar9;
  CCoinsViewDB *view;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  int curr_height;
  anon_class_24_3_af36e733 handle_invalid_snapshot;
  int snapshot_base_height;
  int snapshot_tip_height;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  undefined1 local_268 [224];
  optional<kernel::CCoinsStats> maybe_ibd_stats;
  undefined1 local_b0 [80];
  bool local_60;
  uint256 snapshot_blockhash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  pCVar6 = ActiveChainstate(this);
  SVar5 = SKIPPED;
  if (((((_Var2._M_head_impl != pCVar6) &&
        (pCVar6 = (this->m_snapshot_chainstate)._M_t.
                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
        pCVar6 != (Chainstate *)0x0)) && (pCVar6->m_disabled == false)) &&
      ((_Var2._M_head_impl =
             (this->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
       _Var2._M_head_impl != (Chainstate *)0x0 && ((_Var2._M_head_impl)->m_disabled == false)))) &&
     ((ppCVar3 = *(pointer *)((long)&(_Var2._M_head_impl)->m_chain + 8),
      ppCVar3 != *(pointer *)&((_Var2._M_head_impl)->m_chain).vChain &&
      (ppCVar3[0xffffffffffffffff] != (CBlockIndex *)0x0)))) {
    snapshot_tip_height = ActiveHeight(this);
    maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = GetSnapshotBaseHeight(this)
    ;
    poVar7 = inline_assertion_check<true,std::optional<int>>
                       ((optional<int> *)&maybe_ibd_stats,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17a9,"MaybeCompleteSnapshotValidation","this->GetSnapshotBaseHeight()");
    snapshot_base_height =
         (poVar7->super__Optional_base<int,_true,_true>)._M_payload.
         super__Optional_payload_base<int>._M_payload._M_value;
    _Var2._M_head_impl =
         (this->m_ibd_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    ppCVar3 = *(pointer *)((long)&(_Var2._M_head_impl)->m_chain + 8);
    if (ppCVar3 == *(pointer *)&((_Var2._M_head_impl)->m_chain).vChain) {
      maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = (CBlockIndex *)0x0;
    }
    else {
      maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ =
           ppCVar3[0xffffffffffffffff];
    }
    ppCVar8 = inline_assertion_check<true,CBlockIndex*>
                        ((CBlockIndex **)&maybe_ibd_stats,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0x17aa,"MaybeCompleteSnapshotValidation","m_ibd_chainstate->m_chain.Tip()"
                        );
    this_00 = *ppCVar8;
    if (this_00->nHeight < snapshot_base_height) {
      SVar5 = SKIPPED;
    }
    else {
      SnapshotBlockhash((optional<uint256> *)&maybe_ibd_stats,this);
      if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_payload._M_value.hashBlock.
          super_base_blob<256U>.m_data._M_elems[0x1c] == '\0') {
        __assert_fail("SnapshotBlockhash()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x17b1,
                      "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                     );
      }
      SnapshotBlockhash((optional<uint256> *)&maybe_ibd_stats,this);
      poVar9 = inline_assertion_check<true,std::optional<uint256>>
                         ((optional<uint256> *)&maybe_ibd_stats,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x17b2,"MaybeCompleteSnapshotValidation","SnapshotBlockhash()");
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)
            &(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload;
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 8);
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 0x10);
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 0x18);
      handle_invalid_snapshot.snapshot_tip_height = &snapshot_tip_height;
      handle_invalid_snapshot.snapshot_base_height = &snapshot_base_height;
      handle_invalid_snapshot.this = this;
      CBlockIndex::GetBlockHash((uint256 *)&maybe_ibd_stats,this_00);
      bVar4 = ::operator!=((base_blob<256U> *)&maybe_ibd_stats,
                           &snapshot_blockhash.super_base_blob<256U>);
      if (bVar4) {
        CBlockIndex::ToString_abi_cxx11_((string *)&maybe_ibd_stats,this_00);
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)local_268,(base_blob<256u> *)&snapshot_blockhash);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        logging_function._M_str = "MaybeCompleteSnapshotValidation";
        logging_function._M_len = 0x1f;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int>
                  (logging_function,source_file,0x17d7,ALL,Info,(ConstevalFormatString<3U>)0xcd40d2,
                   (string *)&maybe_ibd_stats,(string *)local_268,&snapshot_base_height);
        std::__cxx11::string::~string((string *)local_268);
        std::__cxx11::string::~string((string *)&maybe_ibd_stats);
        MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                  (&handle_invalid_snapshot);
        SVar5 = BASE_BLOCKHASH_MISMATCH;
      }
      else {
        height = this_00->nHeight;
        if (height != snapshot_base_height) {
          __assert_fail("index_new.nHeight == snapshot_base_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17dc,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        _Var2._M_head_impl =
             (this->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        curr_height = (int)((ulong)((long)*(pointer *)((long)&(_Var2._M_head_impl)->m_chain + 8) -
                                   *(long *)&((_Var2._M_head_impl)->m_chain).vChain) >> 3) + -1;
        if (height != curr_height) {
          __assert_fail("snapshot_base_height == curr_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17e0,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        pCVar6 = (this->m_snapshot_chainstate)._M_t.
                 super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                 super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                 super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        if ((pCVar6 == (Chainstate *)0x0) || (pCVar6->m_disabled == true)) {
          __assert_fail("this->IsUsable(m_snapshot_chainstate.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17e2,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&maybe_ibd_stats,this);
        if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ -
            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ != 0x10) {
          __assert_fail("this->GetAll().size() == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17e3,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                  ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&maybe_ibd_stats);
        view = Chainstate::CoinsDB((this->m_ibd_chainstate)._M_t.
                                   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                   .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        Chainstate::ForceFlushStateToDisk
                  ((this->m_ibd_chainstate)._M_t.
                   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                   super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        CChainParams::AssumeutxoForHeight
                  ((optional<AssumeutxoData> *)local_b0,(this->m_options).chainparams,height);
        if (local_60 == false) {
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_02._M_len = 0x5e;
          logging_function_02._M_str = "MaybeCompleteSnapshotValidation";
          logging_function_02._M_len = 0x1f;
          LogPrintFormatInternal<int>
                    (logging_function_02,source_file_02,0x17eb,ALL,Info,
                     (ConstevalFormatString<1U>)0xcd41d8,&curr_height);
          MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                    (&handle_invalid_snapshot);
          SVar5 = MISSING_CHAINPARAMS;
        }
        else {
          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_engaged = false;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x5e;
          logging_function_00._M_str = "MaybeCompleteSnapshotValidation";
          logging_function_00._M_len = 0x1f;
          LogPrintFormatInternal<>
                    (logging_function_00,source_file_00,0x17f3,ALL,Info,
                     (ConstevalFormatString<0U>)0xcd422e);
          local_288._M_unused._M_object = this->m_interrupt;
          local_288._8_8_ = 0;
          local_270 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp:6137:13)>
                      ::_M_invoke;
          local_278 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp:6137:13)>
                      ::_M_manager;
          kernel::ComputeUTXOStats
                    ((optional<kernel::CCoinsStats> *)local_268,HASH_SERIALIZED,
                     &view->super_CCoinsView,&this->m_blockman,(function<void_()> *)&local_288);
          memcpy(&maybe_ibd_stats,local_268,0xd8);
          std::_Function_base::~_Function_base((_Function_base *)&local_288);
          if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_engaged == false) {
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_03._M_len = 0x5e;
            logging_function_03._M_str = "MaybeCompleteSnapshotValidation";
            logging_function_03._M_len = 0x1f;
            LogPrintFormatInternal<>
                      (logging_function_03,source_file_03,0x1800,ALL,Info,
                       (ConstevalFormatString<0U>)0xcd429e);
            MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                      (&handle_invalid_snapshot);
            SVar5 = STATS_FAILED;
          }
          else {
            local_268._16_8_ =
                 maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                 super__Optional_payload_base<kernel::CCoinsStats>._M_payload._80_8_;
            local_268._24_8_ =
                 maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                 super__Optional_payload_base<kernel::CCoinsStats>._M_payload._88_8_;
            local_268._0_8_ =
                 maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                 super__Optional_payload_base<kernel::CCoinsStats>._M_payload._64_8_;
            local_268._8_8_ =
                 maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                 super__Optional_payload_base<kernel::CCoinsStats>._M_payload._72_8_;
            bVar4 = BaseHash<uint256>::operator!=
                              ((BaseHash<uint256> *)local_268,(BaseHash<uint256> *)(local_b0 + 4));
            if (bVar4) {
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)local_268,
                         (base_blob<256u> *)
                         &maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized);
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)&local_288,(base_blob<256u> *)(local_b0 + 4));
              source_file_01._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_01._M_len = 0x5e;
              logging_function_01._M_str = "MaybeCompleteSnapshotValidation";
              logging_function_01._M_len = 0x1f;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_01,source_file_01,0x1812,ALL,Info,
                         (ConstevalFormatString<2U>)0xcd42db,(string *)local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_288);
              std::__cxx11::string::~string((string *)local_288._M_pod_data);
              std::__cxx11::string::~string((string *)local_268);
              MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                        (&handle_invalid_snapshot);
              SVar5 = HASH_MISMATCH;
            }
            else {
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)local_268,(base_blob<256u> *)&snapshot_blockhash);
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_04._M_len = 0x5e;
              logging_function_04._M_str = "MaybeCompleteSnapshotValidation";
              logging_function_04._M_len = 0x1f;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_04,source_file_04,0x1818,ALL,Info,
                         (ConstevalFormatString<1U>)0xcd430d,(string *)local_268);
              std::__cxx11::string::~string((string *)local_268);
              ((this->m_ibd_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_disabled = true;
              MaybeRebalanceCaches(this);
              SVar5 = SUCCESS;
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return SVar5;
}

Assistant:

SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()
{
    AssertLockHeld(cs_main);
    if (m_ibd_chainstate.get() == &this->ActiveChainstate() ||
            !this->IsUsable(m_snapshot_chainstate.get()) ||
            !this->IsUsable(m_ibd_chainstate.get()) ||
            !m_ibd_chainstate->m_chain.Tip()) {
       // Nothing to do - this function only applies to the background
       // validation chainstate.
       return SnapshotCompletionResult::SKIPPED;
    }
    const int snapshot_tip_height = this->ActiveHeight();
    const int snapshot_base_height = *Assert(this->GetSnapshotBaseHeight());
    const CBlockIndex& index_new = *Assert(m_ibd_chainstate->m_chain.Tip());

    if (index_new.nHeight < snapshot_base_height) {
        // Background IBD not complete yet.
        return SnapshotCompletionResult::SKIPPED;
    }

    assert(SnapshotBlockhash());
    uint256 snapshot_blockhash = *Assert(SnapshotBlockhash());

    auto handle_invalid_snapshot = [&]() EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        bilingual_str user_error = strprintf(_(
            "%s failed to validate the -assumeutxo snapshot state. "
            "This indicates a hardware problem, or a bug in the software, or a "
            "bad software modification that allowed an invalid snapshot to be "
            "loaded. As a result of this, the node will shut down and stop using any "
            "state that was built on the snapshot, resetting the chain height "
            "from %d to %d. On the next "
            "restart, the node will resume syncing from %d "
            "without using any snapshot data. "
            "Please report this incident to %s, including how you obtained the snapshot. "
            "The invalid snapshot chainstate will be left on disk in case it is "
            "helpful in diagnosing the issue that caused this error."),
            PACKAGE_NAME, snapshot_tip_height, snapshot_base_height, snapshot_base_height, PACKAGE_BUGREPORT
        );

        LogError("[snapshot] !!! %s\n", user_error.original);
        LogError("[snapshot] deleting snapshot, reverting to validated chain, and stopping node\n");

        m_active_chainstate = m_ibd_chainstate.get();
        m_snapshot_chainstate->m_disabled = true;
        assert(!this->IsUsable(m_snapshot_chainstate.get()));
        assert(this->IsUsable(m_ibd_chainstate.get()));

        auto rename_result = m_snapshot_chainstate->InvalidateCoinsDBOnDisk();
        if (!rename_result) {
            user_error = strprintf(Untranslated("%s\n%s"), user_error, util::ErrorString(rename_result));
        }

        GetNotifications().fatalError(user_error);
    };

    if (index_new.GetBlockHash() != snapshot_blockhash) {
        LogPrintf("[snapshot] supposed base block %s does not match the "
          "snapshot base block %s (height %d). Snapshot is not valid.\n",
          index_new.ToString(), snapshot_blockhash.ToString(), snapshot_base_height);
        handle_invalid_snapshot();
        return SnapshotCompletionResult::BASE_BLOCKHASH_MISMATCH;
    }

    assert(index_new.nHeight == snapshot_base_height);

    int curr_height = m_ibd_chainstate->m_chain.Height();

    assert(snapshot_base_height == curr_height);
    assert(snapshot_base_height == index_new.nHeight);
    assert(this->IsUsable(m_snapshot_chainstate.get()));
    assert(this->GetAll().size() == 2);

    CCoinsViewDB& ibd_coins_db = m_ibd_chainstate->CoinsDB();
    m_ibd_chainstate->ForceFlushStateToDisk();

    const auto& maybe_au_data = m_options.chainparams.AssumeutxoForHeight(curr_height);
    if (!maybe_au_data) {
        LogPrintf("[snapshot] assumeutxo data not found for height "
            "(%d) - refusing to validate snapshot\n", curr_height);
        handle_invalid_snapshot();
        return SnapshotCompletionResult::MISSING_CHAINPARAMS;
    }

    const AssumeutxoData& au_data = *maybe_au_data;
    std::optional<CCoinsStats> maybe_ibd_stats;
    LogPrintf("[snapshot] computing UTXO stats for background chainstate to validate "
        "snapshot - this could take a few minutes\n");
    try {
        maybe_ibd_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED,
            &ibd_coins_db,
            m_blockman,
            [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return SnapshotCompletionResult::STATS_FAILED;
    }

    // XXX note that this function is slow and will hold cs_main for potentially minutes.
    if (!maybe_ibd_stats) {
        LogPrintf("[snapshot] failed to generate stats for validation coins db\n");
        // While this isn't a problem with the snapshot per se, this condition
        // prevents us from validating the snapshot, so we should shut down and let the
        // user handle the issue manually.
        handle_invalid_snapshot();
        return SnapshotCompletionResult::STATS_FAILED;
    }
    const auto& ibd_stats = *maybe_ibd_stats;

    // Compare the background validation chainstate's UTXO set hash against the hard-coded
    // assumeutxo hash we expect.
    //
    // TODO: For belt-and-suspenders, we could cache the UTXO set
    // hash for the snapshot when it's loaded in its chainstate's leveldb. We could then
    // reference that here for an additional check.
    if (AssumeutxoHash{ibd_stats.hashSerialized} != au_data.hash_serialized) {
        LogPrintf("[snapshot] hash mismatch: actual=%s, expected=%s\n",
            ibd_stats.hashSerialized.ToString(),
            au_data.hash_serialized.ToString());
        handle_invalid_snapshot();
        return SnapshotCompletionResult::HASH_MISMATCH;
    }

    LogPrintf("[snapshot] snapshot beginning at %s has been fully validated\n",
        snapshot_blockhash.ToString());

    m_ibd_chainstate->m_disabled = true;
    this->MaybeRebalanceCaches();

    return SnapshotCompletionResult::SUCCESS;
}